

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

void __thiscall QDateTimeEdit::setDateRange(QDateTimeEdit *this,QDate min,QDate max)

{
  QDateTimeEditPrivate *this_00;
  QDate date;
  long in_FS_OFFSET;
  undefined1 local_40 [16];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (max.jd + 0xb69eeff91fU < 0x16d3e147974 && min.jd + 0xb69eeff91fU < 0x16d3e147974) {
    date.jd = *(qint64 *)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
    ::QVariant::toTime();
    this_00 = (QDateTimeEditPrivate *)(local_40 + 8);
    QDateTimeEditPrivate::dateTimeValue(this_00,date,(QTime)(int)min.jd);
    ::QVariant::toTime();
    QDateTimeEditPrivate::dateTimeValue((QDateTimeEditPrivate *)local_40,date,(QTime)(int)max.jd);
    setDateTimeRange(this,(QDateTime *)this_00,(QDateTime *)local_40);
    QDateTime::~QDateTime((QDateTime *)local_40);
    QDateTime::~QDateTime((QDateTime *)this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::setDateRange(QDate min, QDate max)
{
    Q_D(QDateTimeEdit);
    if (min.isValid() && max.isValid()) {
        setDateTimeRange(d->dateTimeValue(min, d->minimum.toTime()),
                         d->dateTimeValue(max, d->maximum.toTime()));
    }
}